

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O0

int format_to_buffer<unsigned_int,128ul>(uint Value,char (*Buffer) [128])

{
  char *pcVar1;
  char *pcVar2;
  char *local_28;
  char *CurPtr;
  char *EndPtr;
  char (*Buffer_local) [128];
  uint Value_local;
  
  pcVar1 = std::end<char,128ul>(Buffer);
  local_28 = pcVar1;
  Buffer_local._4_4_ = Value;
  do {
    pcVar2 = local_28 + -1;
    local_28[-1] = (char)((ulong)Buffer_local._4_4_ % 10) + '0';
    Buffer_local._4_4_ = Buffer_local._4_4_ / 10;
    local_28 = pcVar2;
  } while (Buffer_local._4_4_ != 0);
  return (int)pcVar1 - (int)pcVar2;
}

Assistant:

static int format_to_buffer(T Value, char (&Buffer)[N]) {
  char *EndPtr = std::end(Buffer);
  char *CurPtr = EndPtr;

  do {
    *--CurPtr = '0' + char(Value % 10);
    Value /= 10;
  } while (Value);
  return EndPtr - CurPtr;
}